

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O1

void __thiscall
VcdGen::TickData::append(TickData *this,tuple<unsigned_long,_unsigned_int> *data,Signal *signal)

{
  pointer *pptVar1;
  iterator __position;
  tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*> local_20;
  
  local_20.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
  super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
  super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
       (data->super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>).
       super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
  local_20.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (data->super__Tuple_impl<0UL,_unsigned_long,_unsigned_int>).
       super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  __position._M_current =
       (this->tick_data_).
       super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->tick_data_).
      super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
    super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
    super__Tuple_impl<2UL,_const_VcdGen::Signal_*>.
    super__Head_base<2UL,_const_VcdGen::Signal_*,_false>._M_head_impl =
         (_Head_base<2UL,_const_VcdGen::Signal_*,_false>)
         (_Head_base<2UL,_const_VcdGen::Signal_*,_false>)signal;
    std::
    vector<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>,std::allocator<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>>>
    ::_M_realloc_insert<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>const&>
              ((vector<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>,std::allocator<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>>>
                *)this,__position,&local_20);
  }
  else {
    ((__position._M_current)->
    super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>).
    super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         local_20.super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    ((__position._M_current)->
    super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>).
    super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
    super__Tuple_impl<2UL,_const_VcdGen::Signal_*>.
    super__Head_base<2UL,_const_VcdGen::Signal_*,_false>._M_head_impl = signal;
    *(ulong *)&((__position._M_current)->
               super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>).
               super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
               super__Head_base<1UL,_unsigned_int,_false> =
         CONCAT44(local_20.
                  super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
                  super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>._12_4_,
                  local_20.
                  super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>.
                  super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
                  super__Head_base<1UL,_unsigned_int,_false>._M_head_impl);
    pptVar1 = &(this->tick_data_).
               super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pptVar1 = *pptVar1 + 1;
  }
  return;
}

Assistant:

void append(tuple<uint64_t, uint32_t> data, const Signal* signal){
        auto tmp = make_tuple(get<0>(data), get<1>(data), signal);
        this->append(tmp);
    }